

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O2

GCtab * lj_tab_new(lua_State *L,uint32_t asize,uint32_t hbits)

{
  uint uVar1;
  uint uVar2;
  uint32_t uVar3;
  GCtab *pGVar4;
  ulong uVar5;
  long lVar6;
  
  pGVar4 = newtab(L,asize,hbits);
  uVar1 = (pGVar4->array).ptr32;
  uVar2 = pGVar4->asize;
  for (uVar5 = 0; uVar2 != uVar5; uVar5 = uVar5 + 1) {
    *(undefined4 *)((ulong)uVar1 + 4 + uVar5 * 8) = 0xffffffff;
  }
  uVar3 = pGVar4->hmask;
  if (uVar3 != 0) {
    uVar5 = (ulong)(pGVar4->node).ptr32;
    for (lVar6 = 0; (ulong)(uVar3 + 1) * 0x18 - lVar6 != 0; lVar6 = lVar6 + 0x18) {
      *(undefined8 *)(uVar5 + 0xc + lVar6) = 0xffffffff;
      *(undefined4 *)(uVar5 + 4 + lVar6) = 0xffffffff;
    }
  }
  return pGVar4;
}

Assistant:

GCtab *lj_tab_new(lua_State *L, uint32_t asize, uint32_t hbits)
{
  GCtab *t = newtab(L, asize, hbits);
  clearapart(t);
  if (t->hmask > 0) clearhpart(t);
  return t;
}